

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_sqrt_vt_m_v_deriv(REF_DBL *m,REF_DBL *v,REF_DBL *f,REF_DBL *df_dv)

{
  double dVar1;
  REF_DBL *df_dv_local;
  REF_DBL *f_local;
  REF_DBL *v_local;
  REF_DBL *m_local;
  
  dVar1 = sqrt(v[2] * (m[5] * v[2] + m[2] * *v + m[4] * v[1]) +
               *v * (m[2] * v[2] + *m * *v + m[1] * v[1]) +
               v[1] * (m[4] * v[2] + m[1] * *v + m[3] * v[1]));
  *f = dVar1;
  *df_dv = (0.5 / *f) * (v[2] * m[2] + v[1] * m[1] + *v * *m + m[2] * v[2] + *m * *v + m[1] * v[1]);
  df_dv[1] = (0.5 / *f) *
             (v[2] * m[4] + *v * m[1] + v[1] * m[3] + m[4] * v[2] + m[1] * *v + m[3] * v[1]);
  df_dv[2] = (0.5 / *f) *
             (v[2] * m[5] + *v * m[2] + v[1] * m[4] + m[5] * v[2] + m[2] * *v + m[4] * v[1]);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_sqrt_vt_m_v_deriv(REF_DBL *m, REF_DBL *v,
                                                REF_DBL *f, REF_DBL *df_dv) {
  *f = sqrt((v)[0] * ((m)[0] * (v)[0] + (m)[1] * (v)[1] + (m)[2] * (v)[2]) +
            (v)[1] * ((m)[1] * (v)[0] + (m)[3] * (v)[1] + (m)[4] * (v)[2]) +
            (v)[2] * ((m)[2] * (v)[0] + (m)[4] * (v)[1] + (m)[5] * (v)[2]));
  df_dv[0] =
      0.5 / (*f) *
      ((v)[0] * (m)[0] + ((m)[0] * (v)[0] + (m)[1] * (v)[1] + (m)[2] * (v)[2]) +
       (v)[1] * (m)[1] + (v)[2] * (m)[2]);
  df_dv[1] =
      0.5 / (*f) *
      ((v)[0] * (m)[1] + (v)[1] * (m)[3] +
       ((m)[1] * (v)[0] + (m)[3] * (v)[1] + (m)[4] * (v)[2]) + (v)[2] * (m)[4]);
  df_dv[2] = 0.5 / (*f) *
             ((v)[0] * (m)[2] + (v)[1] * (m)[4] + (v)[2] * (m)[5] +
              ((m)[2] * (v)[0] + (m)[4] * (v)[1] + (m)[5] * (v)[2]));

  return REF_SUCCESS;
}